

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteDirectoryRule2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *rootLG,DirectoryTarget *dt,char *pass,bool check_all,
          bool check_relink,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands)

{
  cmLocalUnixMakefileGenerator3 *this_00;
  pointer pTVar1;
  pointer pbVar2;
  pointer pbVar3;
  cmGeneratorTarget *this_01;
  pointer pDVar4;
  bool bVar5;
  string *psVar6;
  cmLocalUnixMakefileGenerator3 *this_02;
  pointer pTVar7;
  pointer pDVar8;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  string tname;
  string local_118;
  size_t local_f8;
  char *local_f0;
  string doc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string local_98;
  cmLocalUnixMakefileGenerator3 *local_78;
  ostream *local_70;
  cmGlobalUnixMakefileGenerator3 *local_68;
  DirectoryTarget *local_60;
  char *local_58;
  string makeTarget;
  
  this_00 = (cmLocalUnixMakefileGenerator3 *)dt->LG;
  local_78 = rootLG;
  local_70 = ruleFileStream;
  local_68 = this;
  psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this_00);
  local_118._M_string_length = (size_type)(psVar6->_M_dataplus)._M_p;
  local_118._M_dataplus._M_p = (pointer)psVar6->_M_string_length;
  local_118.field_2._8_8_ = &doc.field_2;
  doc._M_dataplus._M_p = (pointer)0x1;
  doc.field_2._M_local_buf[0] = '/';
  local_118.field_2._M_allocated_capacity = 1;
  doc._M_string_length = local_118.field_2._8_8_;
  local_f8 = strlen(pass);
  views._M_len = 3;
  views._M_array = (iterator)&local_118;
  local_f0 = pass;
  cmCatViews_abi_cxx11_(&makeTarget,views);
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar7 = (dt->Targets).
           super__Vector_base<cmGlobalCommonGenerator::DirectoryTarget::Target,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (dt->Targets).
           super__Vector_base<cmGlobalCommonGenerator::DirectoryTarget::Target,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_60 = dt;
  if (pTVar7 != pTVar1) {
    local_58 = pass;
    do {
      if (check_all) {
        pbVar2 = (pTVar7->ExcludedFromAllInConfigs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar3 = (pTVar7->ExcludedFromAllInConfigs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar2 == pbVar3 && check_relink) {
LAB_004d70b2:
          this_01 = pTVar7->GT;
          cmLocalUnixMakefileGenerator3::GetConfigName_abi_cxx11_(&local_118,this_00);
          bVar5 = cmGeneratorTarget::NeedRelinkBeforeInstall(this_01,&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          pass = local_58;
          if (bVar5) goto LAB_004d7113;
        }
        else if (pbVar2 == pbVar3) goto LAB_004d7113;
      }
      else {
        if (check_relink) goto LAB_004d70b2;
LAB_004d7113:
        this_02 = (cmLocalUnixMakefileGenerator3 *)cmGeneratorTarget::GetLocalGenerator(pTVar7->GT);
        cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                  (&local_98,this_02,pTVar7->GT);
        doc._M_dataplus._M_p = (pointer)0x1;
        local_118.field_2._8_8_ = &doc.field_2;
        doc.field_2._M_local_buf[0] = '/';
        local_118._M_dataplus._M_p = (pointer)local_98._M_string_length;
        local_118._M_string_length = (size_type)local_98._M_dataplus._M_p;
        local_118.field_2._M_allocated_capacity = 1;
        doc._M_string_length = local_118.field_2._8_8_;
        local_f8 = strlen(pass);
        views_00._M_len = 3;
        views_00._M_array = (iterator)&local_118;
        local_f0 = pass;
        cmCatViews_abi_cxx11_(&tname,views_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
                   &tname);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)tname._M_dataplus._M_p != &tname.field_2) {
          operator_delete(tname._M_dataplus._M_p,tname.field_2._M_allocated_capacity + 1);
        }
      }
      pTVar7 = pTVar7 + 1;
    } while (pTVar7 != pTVar1);
  }
  pDVar8 = (local_60->Children).
           super__Vector_base<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar4 = (local_60->Children).
           super__Vector_base<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pDVar8 != pDVar4) {
    do {
      if ((!check_all) || (pDVar8->ExcludeFromAll == false)) {
        local_118._M_string_length = (size_type)(pDVar8->Path)._M_dataplus._M_p;
        local_118._M_dataplus._M_p = (pointer)(pDVar8->Path)._M_string_length;
        doc._M_dataplus._M_p = (pointer)0x1;
        local_118.field_2._8_8_ = &doc.field_2;
        doc.field_2._M_local_buf[0] = '/';
        local_118.field_2._M_allocated_capacity = 1;
        doc._M_string_length = local_118.field_2._8_8_;
        local_f8 = strlen(pass);
        views_01._M_len = 3;
        views_01._M_array = (iterator)&local_118;
        local_f0 = pass;
        cmCatViews_abi_cxx11_(&tname,views_01);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
                   &tname);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)tname._M_dataplus._M_p != &tname.field_2) {
          operator_delete(tname._M_dataplus._M_p,tname.field_2._M_allocated_capacity + 1);
        }
      }
      pDVar8 = pDVar8 + 1;
    } while (pDVar8 != pDVar4);
  }
  if ((depends.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       depends.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((local_68->EmptyRuleHackDepends)._M_string_length != 0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&depends,&local_68->EmptyRuleHackDepends);
  }
  doc._M_dataplus._M_p = (pointer)&doc.field_2;
  doc._M_string_length = 0;
  doc.field_2._M_local_buf[0] = '\0';
  bVar5 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this_00);
  if (bVar5) {
    local_118.field_2._M_allocated_capacity = strlen(pass);
    local_118._M_dataplus._M_p = &DAT_00000014;
    local_118._M_string_length = 0x78f5d5;
    local_f8 = 9;
    local_f0 = "\" target.";
    views_02._M_len = 3;
    views_02._M_array = (iterator)&local_118;
    local_118.field_2._8_8_ = pass;
    cmCatViews_abi_cxx11_(&tname,views_02);
  }
  else {
    local_118.field_2._M_allocated_capacity = strlen(pass);
    local_118._M_dataplus._M_p = (pointer)0xb;
    local_118._M_string_length = 0x78f5f4;
    local_f8 = 0x13;
    local_f0 = "\" directory target.";
    views_03._M_len = 3;
    views_03._M_array = (iterator)&local_118;
    local_118.field_2._8_8_ = pass;
    cmCatViews_abi_cxx11_(&tname,views_03);
  }
  std::__cxx11::string::operator=((string *)&doc,(string *)&tname);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tname._M_dataplus._M_p != &tname.field_2) {
    operator_delete(tname._M_dataplus._M_p,tname.field_2._M_allocated_capacity + 1);
  }
  cmLocalUnixMakefileGenerator3::WriteMakeRule
            (local_78,local_70,doc._M_dataplus._M_p,&makeTarget,&depends,commands,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)doc._M_dataplus._M_p != &doc.field_2) {
    operator_delete(doc._M_dataplus._M_p,
                    CONCAT71(doc.field_2._M_allocated_capacity._1_7_,doc.field_2._M_local_buf[0]) +
                    1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)makeTarget._M_dataplus._M_p != &makeTarget.field_2) {
    operator_delete(makeTarget._M_dataplus._M_p,makeTarget.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteDirectoryRule2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3& rootLG,
  DirectoryTarget const& dt, const char* pass, bool check_all,
  bool check_relink, std::vector<std::string> const& commands)
{
  auto* lg = static_cast<cmLocalUnixMakefileGenerator3*>(dt.LG);
  std::string makeTarget =
    cmStrCat(lg->GetCurrentBinaryDirectory(), '/', pass);

  // The directory-level rule should depend on the target-level rules
  // for all targets in the directory.
  std::vector<std::string> depends;
  for (DirectoryTarget::Target const& t : dt.Targets) {
    // Add this to the list of depends rules in this directory.
    if ((!check_all || t.ExcludedFromAllInConfigs.empty()) &&
        (!check_relink ||
         t.GT->NeedRelinkBeforeInstall(lg->GetConfigName()))) {
      // The target may be from a different directory; use its local gen.
      auto const* tlg = static_cast<cmLocalUnixMakefileGenerator3 const*>(
        t.GT->GetLocalGenerator());
      std::string tname =
        cmStrCat(tlg->GetRelativeTargetDirectory(t.GT), '/', pass);
      depends.push_back(std::move(tname));
    }
  }

  // The directory-level rule should depend on the directory-level
  // rules of the subdirectories.
  for (DirectoryTarget::Dir const& d : dt.Children) {
    if (check_all && d.ExcludeFromAll) {
      continue;
    }
    std::string subdir = cmStrCat(d.Path, '/', pass);
    depends.push_back(std::move(subdir));
  }

  // Work-around for makes that drop rules that have no dependencies
  // or commands.
  if (depends.empty() && !this->EmptyRuleHackDepends.empty()) {
    depends.push_back(this->EmptyRuleHackDepends);
  }

  // Write the rule.
  std::string doc;
  if (lg->IsRootMakefile()) {
    doc = cmStrCat("The main recursive \"", pass, "\" target.");
  } else {
    doc = cmStrCat("Recursive \"", pass, "\" directory target.");
  }

  rootLG.WriteMakeRule(ruleFileStream, doc.c_str(), makeTarget, depends,
                       commands, true);
}